

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_can_pbuf.c
# Opt level: O0

void csp_can_pbuf_cleanup(csp_can_interface_data_t *ifdata,int *task_woken)

{
  uint32_t uVar1;
  long in_RSI;
  long in_RDI;
  csp_packet_t *prev;
  csp_packet_t *packet;
  uint32_t now;
  undefined4 in_stack_ffffffffffffffd0;
  uint32_t uVar2;
  undefined8 local_28;
  undefined8 local_20;
  
  if (in_RSI == 0) {
    uVar1 = csp_get_ms();
  }
  else {
    uVar1 = csp_get_ms_isr();
  }
  local_20 = *(long *)(in_RDI + 0x10);
  local_28 = 0;
  uVar2 = uVar1;
  for (; local_20 != 0; local_20 = *(long *)(local_20 + 0x30)) {
    if (1000 < uVar1 - *(int *)(local_20 + 8)) {
      if (local_28 == 0) {
        *(undefined8 *)(in_RDI + 0x10) = *(undefined8 *)(local_20 + 0x30);
      }
      else {
        *(undefined8 *)(local_28 + 0x30) = *(undefined8 *)(local_20 + 0x30);
      }
      if (in_RSI == 0) {
        csp_buffer_free((void *)CONCAT44(uVar2,in_stack_ffffffffffffffd0));
      }
      else {
        csp_buffer_free_isr((void *)CONCAT44(uVar2,in_stack_ffffffffffffffd0));
      }
    }
    local_28 = local_20;
  }
  return;
}

Assistant:

void csp_can_pbuf_cleanup(csp_can_interface_data_t * ifdata, int * task_woken) {

	uint32_t now = (task_woken) ? csp_get_ms_isr() : csp_get_ms();

	csp_packet_t * packet = ifdata->pbufs;
	csp_packet_t * prev = NULL;

	while (packet) {

		/* Perform cleanup in used pbufs */
		if (now - packet->last_used > PBUF_TIMEOUT_MS) {

			/* Erase from list prev->next = next */
			if (prev) {
				prev->next = packet->next;
			} else {
				ifdata->pbufs = packet->next;
			}

			if (task_woken == NULL) {
				csp_buffer_free(packet);
			} else {
				csp_buffer_free_isr(packet);
			}

		}

		prev = packet;
		packet = packet->next;
	}

}